

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_long_&,_const_long_&> * __thiscall
Catch::ExprLhs<long_const&>::operator<=(ExprLhs<const_long_&> *this,long *rhs)

{
  long *in_RDX;
  undefined8 *in_RSI;
  BinaryExpr<const_long_&,_const_long_&> *in_RDI;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar1;
  char *rawChars;
  BinaryExpr<const_long_&,_const_long_&> *this_00;
  StringRef in_stack_ffffffffffffffd8;
  
  uVar1 = *(long *)*in_RSI <= *in_RDX;
  rawChars = (char *)*in_RSI;
  this_00 = in_RDI;
  StringRef::StringRef((StringRef *)in_RDI,rawChars);
  BinaryExpr<const_long_&,_const_long_&>::BinaryExpr
            (this_00,SUB81((ulong)rawChars >> 0x38,0),(long *)in_RDI,in_stack_ffffffffffffffd8,
             (long *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
  return this_00;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }